

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_test.cc
# Opt level: O2

UniquePtr<BIGNUM> __thiscall
anon_unknown.dwarf_3a28a9::BIGNUMFileTest::GetBIGNUMImpl
          (BIGNUMFileTest *this,char *attribute,bool resize)

{
  FileTest *this_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  char in_CL;
  undefined7 in_register_00000011;
  UniquePtr<BIGNUM> ret;
  string hex;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  this_00 = *(FileTest **)attribute;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,(char *)CONCAT71(in_register_00000011,resize),&local_61);
  bVar1 = FileTest::GetAttribute(this_00,&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  if (!bVar1) {
    this->t_ = (FileTest *)0x0;
    goto LAB_0027720a;
  }
  local_60._M_dataplus._M_p = (pointer)0x0;
  iVar2 = HexToBIGNUM((UniquePtr<BIGNUM> *)&local_60,local_40._M_dataplus._M_p);
  if (iVar2 == (int)local_40._M_string_length) {
    if (in_CL != '\0') {
      uVar3 = *(uint *)(attribute + 0xc);
      if ((*(uint *)(attribute + 8) >> (uVar3 & 0x1f) & 1) != 0) {
        iVar2 = bn_resize_words((BIGNUM *)local_60._M_dataplus._M_p,
                                (long)(int)*(uint *)(local_60._M_dataplus._M_p + 8) * 2 + 1);
        if (iVar2 == 0) goto LAB_002771fc;
        uVar3 = *(uint *)(attribute + 0xc);
      }
      *(uint *)(attribute + 0xc) = uVar3 + 1;
    }
    this->t_ = (FileTest *)local_60._M_dataplus._M_p;
    local_60._M_dataplus._M_p = (pointer)0x0;
  }
  else {
    FileTest::PrintLine(*(FileTest **)attribute,"Could not decode \'%s\'.",local_40._M_dataplus._M_p
                       );
LAB_002771fc:
    this->t_ = (FileTest *)0x0;
  }
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_60);
LAB_0027720a:
  std::__cxx11::string::~string((string *)&local_40);
  return (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)this;
}

Assistant:

bssl::UniquePtr<BIGNUM> GetBIGNUMImpl(const char *attribute, bool resize) {
    std::string hex;
    if (!t_->GetAttribute(&hex, attribute)) {
      return nullptr;
    }

    bssl::UniquePtr<BIGNUM> ret;
    if (HexToBIGNUM(&ret, hex.c_str()) != static_cast<int>(hex.size())) {
      t_->PrintLine("Could not decode '%s'.", hex.c_str());
      return nullptr;
    }
    if (resize) {
      // Test with an oversized |BIGNUM| if necessary.
      if ((large_mask_ & (1 << num_bignums_)) &&
          !bn_resize_words(ret.get(), ret->width * 2 + 1)) {
        return nullptr;
      }
      num_bignums_++;
    }
    return ret;
  }